

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result wabt::TypeChecker::CheckType(Type actual,Type expected)

{
  Result RVar1;
  Enum EVar2;
  Enum EVar3;
  bool bVar4;
  
  EVar3 = actual.enum_;
  EVar2 = expected.enum_;
  if (EVar3 == Any || EVar2 == Any) {
    bVar4 = false;
  }
  else {
    if (EVar3 == Reference && EVar2 == Reference) {
      bVar4 = ((ulong)expected ^ (ulong)actual) >> 0x20 == 0;
    }
    else {
      bVar4 = EVar3 == EVar2;
    }
    bVar4 = !bVar4;
  }
  RVar1.enum_._1_3_ = 0;
  RVar1.enum_._0_1_ = bVar4;
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckType(Type actual, Type expected) {
  if (expected == Type::Any || actual == Type::Any) {
    return Result::Ok;
  }

  if (expected == Type::Reference && actual == Type::Reference) {
    return expected.GetReferenceIndex() == actual.GetReferenceIndex()
               ? Result::Ok
               : Result::Error;
  }
  if (actual != expected) {
    return Result::Error;
  }
  return Result::Ok;
}